

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O2

ModulePtr __thiscall
chaiscript::bootstrap::bootstrap_pod_type<unsigned_short>(bootstrap *this,string *name,ModulePtr *m)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ModulePtr MVar3;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_e0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_d0;
  __shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  bootstrap local_90 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  Type_Info local_40;
  
  peVar1 = (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::string::string((string *)&local_60,(string *)name);
  local_40.m_type_info = (type_info *)&unsigned_short::typeinfo;
  local_40.m_bare_type_info = (type_info *)&unsigned_short::typeinfo;
  local_40.m_flags = 0x10;
  std::
  vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
  ::emplace_back<chaiscript::Type_Info,std::__cxx11::string>
            ((vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
              *)peVar1,&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  peVar1 = (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  constructor<unsigned_short()>();
  std::__cxx11::string::string((string *)&local_80,(string *)name);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)&peVar1->m_funcs,&local_d0,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_d0.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_c0,&m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>);
  construct_pod<unsigned_short>(local_90,name,(ModulePtr *)&local_c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0._M_refcount);
  peVar1 = (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  fun<unsigned_short,std::__cxx11::string_const&>
            ((chaiscript *)&local_e0,parse_string<unsigned_short>);
  std::operator+(&local_b0,"to_",name);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)&peVar1->m_funcs,&local_e0,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e0.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  peVar1 = (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(element_type **)this = peVar1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var2;
  (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  MVar3.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  MVar3.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ModulePtr)MVar3.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ModulePtr bootstrap_pod_type(const std::string &name, ModulePtr m = std::make_shared<Module>())
    {
      m->add(user_type<T>(), name);
      m->add(constructor<T()>(), name);
      construct_pod<T>(name, m);

      m->add(fun(&parse_string<T>), "to_" + name);
      return m;
    }